

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locutil.cpp
# Opt level: O2

Hashtable * icu_63::LocaleUtility::getAvailableLocaleNames(UnicodeString *bundleID)

{
  Hashtable *this;
  Hashtable *pHVar1;
  UEnumeration *en;
  UChar *text;
  Hashtable *pHVar2;
  UnicodeString *pUVar3;
  UErrorCode status;
  CharString cbundleID;
  UnicodeString local_70;
  
  status = U_ZERO_ERROR;
  umtx_initOnce(&LocaleUtilityInitOnce,locale_utility_init,&status);
  this = LocaleUtility_cache;
  if (LocaleUtility_cache == (Hashtable *)0x0) {
    return (Hashtable *)0x0;
  }
  umtx_lock_63((UMutex *)0x0);
  pUVar3 = bundleID;
  pHVar1 = (Hashtable *)Hashtable::get(this,bundleID);
  umtx_unlock_63((UMutex *)0x0);
  if (pHVar1 != (Hashtable *)0x0) {
    return pHVar1;
  }
  pHVar1 = (Hashtable *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar3);
  if (pHVar1 == (Hashtable *)0x0) {
    return (Hashtable *)0x0;
  }
  Hashtable::Hashtable(pHVar1,&status);
  if (U_ZERO_ERROR < status) {
    return pHVar1;
  }
  MaybeStackArray<char,_40>::MaybeStackArray(&cbundleID.buffer);
  cbundleID.len = 0;
  *cbundleID.buffer.ptr = '\0';
  CharString::appendInvariantChars(&cbundleID,bundleID,&status);
  if (cbundleID.len == 0) {
    cbundleID.buffer.ptr = (char *)0x0;
  }
  en = ures_openAvailableLocales_63(cbundleID.buffer.ptr,&status);
  while( true ) {
    pUVar3 = (UnicodeString *)0x0;
    text = uenum_unext_63(en,(int32_t *)0x0,&status);
    if (text == (UChar *)0x0) break;
    UnicodeString::UnicodeString(&local_70,text);
    Hashtable::put(pHVar1,&local_70,pHVar1,&status);
    UnicodeString::~UnicodeString(&local_70);
  }
  uenum_close_63(en);
  if (status < U_ILLEGAL_ARGUMENT_ERROR) {
    umtx_lock_63((UMutex *)0x0);
    pUVar3 = bundleID;
    pHVar2 = (Hashtable *)Hashtable::get(this,bundleID);
    if (pHVar2 == (Hashtable *)0x0) {
      Hashtable::put(this,bundleID,pHVar1,&status);
      umtx_unlock_63((UMutex *)0x0);
      goto LAB_00281db4;
    }
    umtx_unlock_63((UMutex *)0x0);
  }
  else {
    pHVar2 = (Hashtable *)0x0;
  }
  Hashtable::~Hashtable(pHVar1);
  UMemory::operator_delete((UMemory *)pHVar1,pUVar3);
  pHVar1 = pHVar2;
LAB_00281db4:
  MaybeStackArray<char,_40>::~MaybeStackArray(&cbundleID.buffer);
  return pHVar1;
}

Assistant:

const Hashtable*
LocaleUtility::getAvailableLocaleNames(const UnicodeString& bundleID)
{
    // LocaleUtility_cache is a hash-of-hashes.  The top-level keys
    // are path strings ('bundleID') passed to
    // ures_openAvailableLocales.  The top-level values are
    // second-level hashes.  The second-level keys are result strings
    // from ures_openAvailableLocales.  The second-level values are
    // garbage ((void*)1 or other random pointer).

    UErrorCode status = U_ZERO_ERROR;
    umtx_initOnce(LocaleUtilityInitOnce, locale_utility_init, status);
    Hashtable *cache = LocaleUtility_cache;
    if (cache == NULL) {
        // Catastrophic failure.
        return NULL;
    }

    Hashtable* htp;
    umtx_lock(NULL);
    htp = (Hashtable*) cache->get(bundleID);
    umtx_unlock(NULL);

    if (htp == NULL) {
        htp = new Hashtable(status);
        if (htp && U_SUCCESS(status)) {
            CharString cbundleID;
            cbundleID.appendInvariantChars(bundleID, status);
            const char* path = cbundleID.isEmpty() ? NULL : cbundleID.data();
            UEnumeration *uenum = ures_openAvailableLocales(path, &status);
            for (;;) {
                const UChar* id = uenum_unext(uenum, NULL, &status);
                if (id == NULL) {
                    break;
                }
                htp->put(UnicodeString(id), (void*)htp, status);
            }
            uenum_close(uenum);
            if (U_FAILURE(status)) {
                delete htp;
                return NULL;
            }
            umtx_lock(NULL);
            Hashtable *t = static_cast<Hashtable *>(cache->get(bundleID));
            if (t != NULL) {
                // Another thread raced through this code, creating the cache entry first.
                // Discard ours and return theirs.
                umtx_unlock(NULL);
                delete htp;
                htp = t;
            } else {
                cache->put(bundleID, (void*)htp, status);
                umtx_unlock(NULL);
            }
        }
    }
    return htp;
}